

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-errno.c
# Opt level: O0

void coda_set_error_message_vargs(char *message,__va_list_tag *ap)

{
  long *in_FS_OFFSET;
  char local_1028 [8];
  char message_buffer [4097];
  __va_list_tag *ap_local;
  char *message_local;
  
  if (message == (char *)0x0) {
    *(undefined1 *)(*in_FS_OFFSET + -0x11e0) = 0;
  }
  else {
    vsnprintf(local_1028,0x1000,message,ap);
    message_buffer[0xff8] = '\0';
    strcpy((char *)(*in_FS_OFFSET + -0x11e0),local_1028);
  }
  return;
}

Assistant:

void coda_set_error_message_vargs(const char *message, va_list ap)
{
    if (message == NULL)
    {
        coda_error_message_buffer[0] = '\0';
    }
    else
    {
        char message_buffer[MAX_ERROR_INFO_LENGTH + 1];

        /* write to local buffer first in order to allow using the result of coda_errno_to_string inside the va_list */
        vsnprintf(message_buffer, MAX_ERROR_INFO_LENGTH, message, ap);
        message_buffer[MAX_ERROR_INFO_LENGTH] = '\0';
        strcpy(coda_error_message_buffer, message_buffer);
    }
}